

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

void vera::splitFacesFromVerticalCross<float>
               (float *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<float> **_faces)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  ulong uVar4;
  CubemapFace<float> *pCVar5;
  float *pfVar6;
  ulong uVar7;
  int iVar8;
  CubemapFace<float> **ppCVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  
  lVar11 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _width;
  lVar3 = SUB168(auVar1 / ZEXT816(3),0);
  iVar2 = SUB164(auVar1 / ZEXT816(3),0);
  iVar8 = (int)(_height >> 2);
  uVar4 = (ulong)(uint)(iVar2 * iVar8) * 0x300000000;
  uVar7 = 0xffffffffffffffff;
  if (-1 < (long)uVar4) {
    uVar7 = uVar4 >> 0x1e;
  }
  for (; lVar11 != 6; lVar11 = lVar11 + 1) {
    pCVar5 = (CubemapFace<float> *)operator_new(0x18);
    pCVar5->data = (float *)0x0;
    pCVar5->id = 0;
    pCVar5->width = 0;
    pCVar5->height = 0;
    pCVar5->currentOffset = 0;
    _faces[lVar11] = pCVar5;
    pCVar5->id = (int)lVar11;
    pfVar6 = (float *)operator_new__(uVar7);
    pCVar5->data = pfVar6;
    pCVar5->width = iVar2;
    pCVar5->height = iVar8;
    pCVar5->currentOffset = 0;
  }
  lVar11 = 0;
  for (uVar7 = 0; uVar7 != _height; uVar7 = uVar7 + 1) {
    lVar10 = 3;
    lVar12 = lVar11;
    while (lVar10 != 0) {
      iVar13 = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                    (long)iVar8);
      ppCVar9 = _faces;
      if (((((iVar13 == 1 && lVar10 == 1) || (ppCVar9 = _faces + 1, iVar13 == 1 && lVar10 == 3)) ||
           (ppCVar9 = _faces + 2, iVar13 == 0 && lVar10 == 2)) ||
          (((ppCVar9 = _faces + 3, iVar13 == 2 && lVar10 == 2 ||
            (ppCVar9 = _faces + 4, iVar13 == 1 && lVar10 == 2)) ||
           (ppCVar9 = _faces + 5, iVar13 == 3 && lVar10 == 2)))) &&
         (pCVar5 = *ppCVar9, pCVar5 != (CubemapFace<float> *)0x0)) {
        memcpy(pCVar5->data + pCVar5->currentOffset,(void *)((lVar12 >> 0x1e) + (long)_data),
               lVar3 * 0xc00000000 >> 0x20);
        pCVar5->currentOffset = pCVar5->currentOffset + iVar2 * 3;
      }
      lVar12 = lVar12 + lVar3 * 0x300000000;
      lVar10 = lVar10 + -1;
    }
    lVar11 = lVar11 + _width * 0x300000000;
  }
  return;
}

Assistant:

void splitFacesFromVerticalCross(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width / 3;
    int faceHeight = _height / 4;

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        int jFace = (l - (l % faceHeight)) / faceHeight;

        for (int iFace = 0; iFace < 3; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = 3 * (faceWidth * iFace + l * _width);

            //      0   1   2   i
            //  3      -Z       
            //  2      -X 
            //  1  -Y  +Z  +Y       
            //  0      +X
            //  j
            //
            if (iFace == 2 && jFace == 1) face = _faces[0]; // POS_Y
            if (iFace == 0 && jFace == 1) face = _faces[1]; // NEG_Y
            if (iFace == 1 && jFace == 0) face = _faces[2]; // POS_X
            if (iFace == 1 && jFace == 2) face = _faces[3]; // NEG_X
            if (iFace == 1 && jFace == 1) face = _faces[4]; // POS_Z
            if (iFace == 1 && jFace == 3) face = _faces[5]; // NEG_Z

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * 3;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (3 * faceWidth);
            }
        }
    }
}